

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::Clear(TreeEnsembleParameters_TreeNode *this)

{
  uint32_t cached_has_bits;
  TreeEnsembleParameters_TreeNode *this_local;
  
  google::protobuf::
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::Clear
            (&this->evaluationinfo_);
  memset(&this->treeid_,0,0x40);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  evaluationinfo_.Clear();
  ::memset(&treeid_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&relativehitrate_) -
      reinterpret_cast<char*>(&treeid_)) + sizeof(relativehitrate_));
  _internal_metadata_.Clear<std::string>();
}